

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxp.c
# Opt level: O3

_Bool duckdb_je_fxp_parse(fxp_t *result,char *str,char **end)

{
  byte *pbVar1;
  _Bool _Var2;
  long lVar3;
  int iVar4;
  long lVar5;
  char *cur;
  byte *pbVar6;
  uint uVar7;
  fxp_t fVar8;
  byte bVar9;
  
  bVar9 = *str;
  _Var2 = true;
  if (bVar9 == 0x2e || (byte)(bVar9 - 0x30) < 10) {
    fVar8 = 0;
    if ((byte)(bVar9 - 0x30) < 10) {
      uVar7 = 0;
      do {
        uVar7 = (uint)(byte)(bVar9 - 0x30) + uVar7 * 10;
        if (0xffff < uVar7) {
          return true;
        }
        bVar9 = ((byte *)str)[1];
        str = (char *)((byte *)str + 1);
      } while ((byte)(bVar9 - 0x30) < 10);
      fVar8 = uVar7 * 0x10000;
    }
    if (bVar9 == 0x2e) {
      if (9 < (byte)(((byte *)str)[1] - 0x30)) {
        return true;
      }
      iVar4 = 0xe;
      lVar3 = 0;
      pbVar1 = (byte *)str + 1;
      do {
        pbVar6 = pbVar1;
        bVar9 = *pbVar6 - 0x30;
        lVar5 = (ulong)*pbVar6 - 0x30;
        if (9 < bVar9) {
          lVar5 = 0;
        }
        lVar3 = lVar5 + lVar3 * 10;
        iVar4 = iVar4 + -1;
        pbVar1 = pbVar6 + (bVar9 < 10);
      } while (iVar4 != 0);
      str = (char *)(pbVar6 + ((ulong)(bVar9 < 10) - 1));
      do {
        pbVar1 = (byte *)str + 1;
        str = (char *)((byte *)str + 1);
      } while ((byte)(*pbVar1 - 0x30) < 10);
      fVar8 = fVar8 + (int)((ulong)(lVar3 * 0x10000) / 100000000000000);
    }
    *result = fVar8;
    if (end != (char **)0x0) {
      *end = str;
    }
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool
fxp_parse(fxp_t *result, const char *str, char **end) {
	/*
	 * Using malloc_strtoumax in this method isn't as handy as you might
	 * expect (I tried). In the fractional part, significant leading zeros
	 * mean that you still need to do your own parsing, now with trickier
	 * math.  In the integer part, the casting (uintmax_t to uint32_t)
	 * forces more reasoning about bounds than just checking for overflow as
	 * we parse.
	 */
	uint32_t integer_part = 0;

	const char *cur = str;

	/* The string must start with a digit or a decimal point. */
	if (*cur != '.' && !fxp_isdigit(*cur)) {
		return true;
	}

	while ('0' <= *cur && *cur <= '9') {
		integer_part *= 10;
		integer_part += *cur - '0';
		if (integer_part >= (1U << 16)) {
			return true;
		}
		cur++;
	}

	/*
	 * We've parsed all digits at the beginning of the string, without
	 * overflow.  Either we're done, or there's a fractional part.
	 */
	if (*cur != '.') {
		*result = (integer_part << 16);
		if (end != NULL) {
			*end = (char *)cur;
		}
		return false;
	}

	/* There's a fractional part. */
	cur++;
	if (!fxp_isdigit(*cur)) {
		/* Shouldn't end on the decimal point. */
		return true;
	}

	/*
	 * We use a lot of precision for the fractional part, even though we'll
	 * discard most of it; this lets us get exact values for the important
	 * special case where the denominator is a small power of 2 (for
	 * instance, 1/512 == 0.001953125 is exactly representable even with
	 * only 16 bits of fractional precision).  We need to left-shift by 16
	 * before dividing so we pick the number of digits to be
	 * floor(log(2**48)) = 14.
	 */
	uint64_t fractional_part = 0;
	uint64_t frac_div = 1;
	for (int i = 0; i < FXP_FRACTIONAL_PART_DIGITS; i++) {
		fractional_part *= 10;
		frac_div *= 10;
		if (fxp_isdigit(*cur)) {
			fractional_part += *cur - '0';
			cur++;
		}
	}
	/*
	 * We only parse the first maxdigits characters, but we can still ignore
	 * any digits after that.
	 */
	while (fxp_isdigit(*cur)) {
		cur++;
	}

	assert(fractional_part < frac_div);
	uint32_t fractional_repr = (uint32_t)(
	    (fractional_part << 16) / frac_div);

	/* Success! */
	*result = (integer_part << 16) + fractional_repr;
	if (end != NULL) {
		*end = (char *)cur;
	}
	return false;
}